

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O0

RGBUnboundedSpectrum pbrt::HairBxDF::SigmaAFromConcentration(Float ce,Float cp)

{
  RGB *this;
  RGB s;
  RGB s_00;
  RGB rgb;
  undefined1 auVar4 [56];
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  Float FVar5;
  RGB RVar6;
  RGB sigma_a;
  RGB pheomelaninSigma_a;
  RGB eumelaninSigma_a;
  undefined8 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  Float in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff7c;
  RGBUnboundedSpectrum *this_00;
  Float in_stack_ffffffffffffff9c;
  RGB local_30;
  RGB local_24;
  RGBUnboundedSpectrum local_10;
  undefined1 auVar1 [64];
  
  RGB::RGB(&local_24,0.419,0.697,1.37);
  RGB::RGB(&local_30,0.187,0.4,1.05);
  auVar4 = (undefined1  [56])0x0;
  FVar5 = (Float)((ulong)in_stack_ffffffffffffff10 >> 0x20);
  RVar6.g = (Float)in_stack_ffffffffffffff2c;
  RVar6.r = (Float)in_stack_ffffffffffffff28;
  RVar6.b = in_stack_ffffffffffffff30;
  RVar6 = pbrt::operator*(FVar5,RVar6);
  auVar1._0_8_ = RVar6._0_8_;
  auVar1._8_56_ = auVar4;
  this_00 = (RGBUnboundedSpectrum *)vmovlpd_avx(auVar1._0_16_);
  auVar4 = (undefined1  [56])0x0;
  s.g = (Float)in_stack_ffffffffffffff2c;
  s.r = (Float)in_stack_ffffffffffffff28;
  s.b = in_stack_ffffffffffffff30;
  RVar6 = pbrt::operator*(FVar5,s);
  FVar5 = RVar6.b;
  auVar2._0_8_ = RVar6._0_8_;
  auVar2._8_56_ = auVar4;
  this = (RGB *)vmovlpd_avx(auVar2._0_16_);
  auVar4 = ZEXT856(0);
  s_00.g = (Float)in_stack_ffffffffffffff4c;
  s_00.r = FVar5;
  s_00.b = local_30.r;
  RVar6 = RGB::operator+(this,s_00);
  auVar3._0_8_ = RVar6._0_8_;
  auVar3._8_56_ = auVar4;
  vmovlpd_avx(auVar3._0_16_);
  rgb.g = local_24.r;
  rgb.b = local_24.g;
  rgb.r = in_stack_ffffffffffffff9c;
  RGBUnboundedSpectrum::RGBUnboundedSpectrum
            (this_00,(RGBColorSpace *)CONCAT44(in_stack_ffffffffffffff7c,FVar5),rgb);
  return local_10;
}

Assistant:

PBRT_CPU_GPU RGBUnboundedSpectrum HairBxDF::SigmaAFromConcentration(Float ce, Float cp) {
    RGB eumelaninSigma_a(0.419f, 0.697f, 1.37f);
    RGB pheomelaninSigma_a(0.187f, 0.4f, 1.05f);
    RGB sigma_a = ce * eumelaninSigma_a + cp * pheomelaninSigma_a;
#ifdef PBRT_IS_GPU_CODE
    return RGBUnboundedSpectrum(*RGBColorSpace_sRGB, sigma_a);
#else
    return RGBUnboundedSpectrum(*RGBColorSpace::sRGB, sigma_a);
#endif
}